

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O3

void UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UChar UVar2;
  ushort uVar3;
  UChar *pUVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  undefined1 uVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  UConverter *cnv;
  uint uVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  void *pvVar21;
  uint32_t uVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  UChar *pUVar27;
  byte abStack_c4 [4];
  undefined4 local_c0;
  undefined4 local_bc;
  uint local_b4;
  uint32_t value;
  undefined4 uStack_ac;
  int *local_a8;
  UChar *local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  char *local_88;
  ulong local_80;
  UConverter *local_78;
  UChar *local_70;
  void *local_68;
  uint local_60;
  uint local_5c;
  undefined4 *local_58;
  char *local_50;
  ulong local_48;
  UErrorCode *local_40;
  UConverterFromUnicodeArgs *local_38;
  
  cnv = args->converter;
  pUVar27 = args->source;
  pcVar20 = args->target;
  local_70 = args->sourceLimit;
  local_a8 = args->offsets;
  pvVar21 = cnv->extraInfo;
  local_58 = (undefined4 *)((long)pvVar21 + 0x62);
  uVar25 = cnv->fromUChar32;
  local_88 = args->targetLimit;
  uVar17 = 0;
  uVar22 = 0;
  local_38 = args;
  local_40 = err;
  local_78 = cnv;
  local_68 = pvVar21;
  if (uVar25 != 0 && pcVar20 < args->targetLimit) goto LAB_00322e36;
LAB_00322dfe:
  do {
    if (local_70 <= pUVar27) {
LAB_00322f6b:
      if ((((*err < U_ILLEGAL_ARGUMENT_ERROR) && (*(char *)((long)pvVar21 + 0x66) != '\0')) &&
          (args->flush != '\0')) && ((local_70 <= pUVar27 && (cnv->fromUChar32 == 0)))) {
        *(undefined1 *)((long)pvVar21 + 0x66) = 0;
        pUVar4 = args->source;
        iVar16 = (int)((ulong)((long)pUVar27 - (long)pUVar4) >> 1);
        if (iVar16 < 1) {
          uVar25 = 0xffffffff;
        }
        else {
          uVar25 = iVar16 - 1;
          if (((pUVar4[uVar25] & 0xfc00U) == 0xdc00) &&
             ((uVar25 == 0 || ((pUVar4[iVar16 - 2] & 0xfc00U) == 0xd800)))) {
            uVar25 = iVar16 - 2;
          }
        }
        _value = pcVar20;
        ucnv_fromUWriteBytes_63(cnv,"\x0f",1,(char **)&value,local_88,&local_a8,uVar25,err);
        pcVar20 = _value;
      }
      goto LAB_00323585;
    }
    if (local_88 <= pcVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_00323585;
    }
    UVar2 = *pUVar27;
    uVar25 = (uint)(ushort)UVar2;
    pUVar27 = pUVar27 + 1;
    pcVar19 = pcVar20;
    if ((uVar25 & 0xf800) == 0xd800) {
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_00322e36:
        if (local_70 <= pUVar27) {
          cnv->fromUChar32 = uVar25;
          goto LAB_00322f6b;
        }
        UVar2 = *pUVar27;
        pcVar19 = pcVar20;
        if (((ushort)UVar2 & 0xfc00) == 0xdc00) {
          pUVar27 = pUVar27 + 1;
          uVar25 = uVar25 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
          cnv->fromUChar32 = 0;
          goto LAB_00322e72;
        }
      }
LAB_00322f46:
      *err = U_ILLEGAL_CHAR_FOUND;
      cnv->fromUChar32 = uVar25;
      pcVar20 = pcVar19;
      goto LAB_00323585;
    }
LAB_00322e72:
    if (0x7f < (int)uVar25) {
      local_50 = pcVar19;
      local_a0 = pUVar27;
      if (uVar17 == 0) {
        bVar24 = *(byte *)((long)pvVar21 + 99);
        abStack_c4[1] = bVar24 + (bVar24 == 0);
        if (*(int *)((long)pvVar21 + 0x6c) == 1) {
          if (abStack_c4[1] == '\x02') {
            abStack_c4[2] = 1;
            abStack_c4[3] = 0x21;
          }
          else if (abStack_c4[1] == '\x01') {
            abStack_c4[2] = 0x21;
            abStack_c4[3] = 2;
          }
          else {
            abStack_c4[2] = 1;
            abStack_c4[3] = 2;
          }
          uVar17 = 3;
        }
        else {
          if (*(int *)((long)pvVar21 + 0x6c) != 0) goto LAB_0032356a;
          if (bVar24 < 2) {
            abStack_c4[2] = 0x21;
          }
          else {
            abStack_c4[2] = 1;
          }
          uVar17 = 2;
        }
LAB_00323016:
        local_c0 = (int)CONCAT71((int7)((ulong)local_78 >> 8),local_78->useFallback);
        local_48 = (ulong)(uVar25 >> 10);
        local_8c = uVar25 & 0xf;
        local_90 = 0x10000 << (sbyte)(uVar25 & 0xf);
        uVar15 = uVar25 >> 4 & 0x3f;
        local_94 = uVar25 - 0xe000;
        local_98 = uVar25 - 0xf0000;
        local_60 = uVar17;
        uVar12 = (ulong)uVar17;
        uVar26 = 1;
        bVar23 = 0;
        bVar24 = 0;
        local_b4 = 0;
        iVar16 = 0;
        local_80 = uVar12;
        local_5c = uVar15;
        do {
          bVar1 = abStack_c4[uVar26];
          if (0 < (long)(char)bVar1) {
            if (bVar1 < 0x20) {
              lVar14 = *(long *)((long)pvVar21 + (long)(char)bVar1 * 8);
              if ((0xffff < uVar25) && ((*(byte *)(lVar14 + 0xfd) & 1) == 0)) goto LAB_00323112;
              uVar17 = *(uint *)(*(long *)(lVar14 + 0x58) +
                                (ulong)(*(ushort *)(*(long *)(lVar14 + 0x58) + local_48 * 2) +
                                       uVar15) * 4);
              uVar3 = *(ushort *)
                       (*(long *)(lVar14 + 0xe8) + (ulong)((uVar17 & 0xffff) * 0x10 + local_8c) * 2)
              ;
              uVar13 = (uint)uVar3;
              if ((local_90 & uVar17) == 0) {
                if (((UBool)local_c0 == '\0') && (0x18ff < local_94)) {
                  if ((0x1ffff < local_98) || (uVar3 == 0)) goto LAB_00323112;
LAB_00323338:
                  uVar17 = uVar3 < 0x100 | 0xfffffffe;
                  _value = (char *)CONCAT44(uStack_ac,uVar13);
                }
                else {
                  if (uVar3 != 0) goto LAB_00323338;
LAB_00323112:
                  if (*(int32_t **)(lVar14 + 0x120) == (int32_t *)0x0) goto LAB_0032336b;
                  uVar17 = ucnv_extSimpleMatchFromU_63
                                     (*(int32_t **)(lVar14 + 0x120),uVar25,&value,(UBool)local_c0);
                  uVar12 = local_80;
                  pvVar21 = local_68;
                  uVar15 = local_5c;
                  iVar11 = 2;
                  if (uVar17 == 2) goto LAB_00323351;
                }
                if ((uVar17 != 0xfffffffe) || (iVar11 = -2, iVar16 != 0)) goto LAB_0032336b;
              }
              else {
                _value = (char *)CONCAT44(uStack_ac,uVar13);
                iVar11 = 2;
                if (uVar13 < 0x100) goto LAB_0032336b;
              }
LAB_00323351:
              iVar16 = iVar11;
              bVar23 = 1;
              bVar24 = 1;
              local_c0 = 0;
              local_b4 = (uint)(char)bVar1;
            }
            else {
              lVar14 = *(long *)((long)pvVar21 + 0x18);
              if ((uVar25 < 0x10000) || ((*(byte *)(lVar14 + 0xfd) & 1) != 0)) {
                lVar5 = *(long *)(lVar14 + 0xe8);
                uVar17 = *(uint *)(*(long *)(lVar14 + 0x58) +
                                  (ulong)(*(ushort *)(*(long *)(lVar14 + 0x58) + local_48 * 2) +
                                         uVar15) * 4);
                lVar6 = (ulong)((uVar17 & 0xffff) * 0x10 + local_8c) * 3;
                uVar18 = (uint)*(byte *)(lVar5 + 1 + lVar6) << 8 |
                         (uint)*(byte *)(lVar5 + lVar6) << 0x10;
                uVar13 = *(byte *)(lVar5 + 2 + lVar6) | uVar18;
                uVar9 = (ulong)(3 - (*(byte *)(lVar5 + lVar6) == 0));
                if (uVar18 == 0) {
                  uVar9 = 1;
                }
                if ((local_90 & uVar17) != 0) {
                  _value = (char *)CONCAT44(uStack_ac,uVar13);
                  goto LAB_003231dd;
                }
                uVar12 = local_80;
                if (((((UBool)local_c0 == '\0') && (0x18ff < local_94)) && (0x1ffff < local_98)) ||
                   (uVar13 == 0)) goto LAB_003230bc;
                _value = (char *)CONCAT44(uStack_ac,uVar13);
                uVar9 = (ulong)(uint)-(int)uVar9;
LAB_003232c4:
                uVar12 = local_80;
                if (((int)uVar9 != -3) || (iVar16 != 0)) goto LAB_0032336b;
                local_c0 = 0;
                iVar16 = -2;
                iVar11 = -2;
              }
              else {
LAB_003230bc:
                if (*(int32_t **)(lVar14 + 0x120) == (int32_t *)0x0) goto LAB_0032336b;
                uVar17 = ucnv_extSimpleMatchFromU_63
                                   (*(int32_t **)(lVar14 + 0x120),uVar25,&value,(UBool)local_c0);
                uVar9 = (ulong)uVar17;
                pvVar21 = local_68;
LAB_003231dd:
                if ((int)uVar9 != 3) goto LAB_003232c4;
                iVar16 = 2;
                iVar11 = 2;
              }
              cVar10 = (char)((ulong)_value >> 0x10);
              uVar12 = local_80;
              if (cVar10 == -0x7f) {
                bVar23 = 1;
                bVar24 = 1;
                local_b4 = (uint)CONCAT71((int7)(uVar9 >> 8),0x21);
                iVar16 = iVar11;
              }
              else {
                if ((value >> 0x10 & 0xff) != 0x82) {
                  local_b4 = (uint)CONCAT11((char)((ulong)_value >> 0x18),cVar10 + -0x60);
                  uVar22 = value;
                  if (*(int *)((long)pvVar21 + 0x6c) == 1) {
                    bVar24 = 3;
                    bVar23 = bVar24;
                  }
                  else {
                    iVar16 = 0;
                    bVar24 = bVar23;
                  }
                  goto LAB_0032336b;
                }
                bVar23 = 2;
                bVar24 = 2;
                local_b4 = 0x22;
                iVar16 = iVar11;
              }
            }
            uVar22 = value;
          }
LAB_0032336b:
          args = local_38;
          err = local_40;
          pcVar19 = local_50;
          cnv = local_78;
          pUVar27 = local_a0;
        } while ((uVar26 < uVar12) && (uVar26 = uVar26 + 1, iVar16 < 1));
        if (iVar16 != 0) {
          uVar15 = 0;
          cVar10 = (char)local_b4;
          uVar17 = local_60;
          if (cVar10 != *(char *)((long)local_58 + (ulong)bVar24)) {
            lVar14 = (long)cVar10 + -0x1e;
            if (cVar10 < '\x03') {
              lVar14 = (long)cVar10;
            }
            local_bc = *(int *)(_ZL13escSeqCharsCN_rel +
                               *(int *)(_ZL13escSeqCharsCN_rel + lVar14 * 4));
            *(char *)((long)local_58 + (ulong)bVar24) = cVar10;
            if (bVar24 == 1) {
              uVar17 = 0;
            }
            uVar15 = 4;
          }
          if (bVar24 != *(byte *)((long)pvVar21 + 0x66)) {
            uVar26 = (ulong)uVar15;
            uVar12 = uVar26 | 1;
            if (bVar24 == 2) {
              *(undefined1 *)((long)&local_bc + uVar26) = 0x1b;
              uVar15 = uVar15 | 2;
              *(undefined1 *)((long)&local_bc + uVar12) = 0x4e;
            }
            else if (bVar24 == 1) {
              *(undefined1 *)((long)&local_bc + uVar26) = 0xe;
              *(undefined1 *)((long)pvVar21 + 0x66) = 1;
              uVar15 = (uint)uVar12;
            }
            else {
              *(undefined1 *)((long)&local_bc + uVar26) = 0x1b;
              uVar15 = uVar15 | 2;
              *(undefined1 *)((long)&local_bc + uVar12) = 0x4f;
            }
          }
          iVar16 = uVar15 + 2;
          *(ushort *)((long)&local_bc + (ulong)uVar15) = (ushort)uVar22 << 8 | (ushort)uVar22 >> 8;
          goto LAB_00323452;
        }
      }
      else if (0 < (int)uVar17) goto LAB_00323016;
LAB_0032356a:
      *err = U_INVALID_CHAR_FOUND;
      local_78->fromUChar32 = uVar25;
      pcVar20 = local_50;
      pUVar27 = local_a0;
      goto LAB_00323585;
    }
    if (((int)uVar25 < 0x20) && ((0x800c000U >> (uVar25 & 0x1f) & 1) != 0)) goto LAB_00322f46;
    iVar16 = 1;
    uVar8 = (undefined1)uVar25;
    if (*(char *)((long)pvVar21 + 0x66) != '\0') {
      local_bc = (uint)CONCAT21(local_bc._2_2_,uVar8) << 8;
      *(undefined1 *)((long)pvVar21 + 0x66) = 0;
      iVar16 = 2;
      uVar17 = 0;
      uVar8 = 0xf;
    }
    local_bc = CONCAT31(local_bc._1_3_,uVar8);
    if ((uVar25 == 0xd) || (uVar25 == 10)) {
      *(undefined2 *)(local_58 + 1) = 0;
      *local_58 = 0;
      uVar17 = 0;
    }
LAB_00323452:
    piVar7 = local_a8;
    if (iVar16 == 2) {
      pcVar20 = pcVar19 + 2;
      if (pcVar20 <= local_88) {
        *pcVar19 = (char)local_bc;
        pcVar19[1] = local_bc._1_1_;
        if (local_a8 != (int *)0x0) {
          iVar16 = -1;
          if (0xffff < uVar25) {
            iVar16 = -2;
          }
          iVar16 = (int)((ulong)((long)pUVar27 - (long)args->source) >> 1) + iVar16;
          *local_a8 = iVar16;
          local_a8 = local_a8 + 2;
          piVar7[1] = iVar16;
        }
        goto LAB_00322dfe;
      }
    }
    else if (iVar16 == 1) {
      *pcVar19 = (char)local_bc;
      pcVar20 = pcVar19 + 1;
      if (local_a8 != (int *)0x0) {
        local_a8 = local_a8 + 1;
        *piVar7 = (int)((ulong)((long)pUVar27 - (long)args->source) >> 1) + -1;
      }
      goto LAB_00322dfe;
    }
    iVar11 = -1;
    if (0xffff < uVar25) {
      iVar11 = -2;
    }
    _value = pcVar19;
    local_a0 = pUVar27;
    ucnv_fromUWriteBytes_63
              (cnv,(char *)&local_bc,iVar16,(char **)&value,local_88,&local_a8,
               (int)((ulong)((long)pUVar27 - (long)args->source) >> 1) + iVar11,err);
    pcVar20 = _value;
    pvVar21 = local_68;
    pUVar27 = local_a0;
    if (U_ZERO_ERROR < *err) {
LAB_00323585:
      args->source = pUVar27;
      args->target = pcVar20;
      return;
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len;
    int8_t choices[3];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do the conversion */
            if(sourceChar <= 0x007f ){
                /* do not convert SO/SI/ESC */
                if(IS_2022_CONTROL(sourceChar)) {
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }

                /* US-ASCII */
                if(pFromU2022State->g == 0) {
                    buffer[0] = (char)sourceChar;
                    len = 1;
                } else {
                    buffer[0] = UCNV_SI;
                    buffer[1] = (char)sourceChar;
                    len = 2;
                    pFromU2022State->g = 0;
                    choiceCount = 0;
                }
                if(sourceChar == CR || sourceChar == LF) {
                    /* reset the state at the end of a line */
                    uprv_memset(pFromU2022State, 0, sizeof(ISO2022State));
                    choiceCount = 0;
                }
            }
            else{
                /* convert U+0080..U+10ffff */
                int32_t i;
                int8_t cs, g;

                if(choiceCount == 0) {
                    /* try the current SO/G1 converter first */
                    choices[0] = pFromU2022State->cs[1];

                    /* default to GB2312_1 if none is designated yet */
                    if(choices[0] == 0) {
                        choices[0] = GB2312_1;
                    }

                    if(converterData->version == 0) {
                        /* ISO-2022-CN */

                        /* try the other SO/G1 converter; a CNS_11643_1 lookup may result in any plane */
                        if(choices[0] == GB2312_1) {
                            choices[1] = (int8_t)CNS_11643_1;
                        } else {
                            choices[1] = (int8_t)GB2312_1;
                        }

                        choiceCount = 2;
                    } else if (converterData->version == 1) {
                        /* ISO-2022-CN-EXT */

                        /* try one of the other converters */
                        switch(choices[0]) {
                        case GB2312_1:
                            choices[1] = (int8_t)CNS_11643_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        case ISO_IR_165:
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)CNS_11643_1;
                            break;
                        default: /* CNS_11643_x */
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        }

                        choiceCount = 3;
                    } else {
                        choices[0] = (int8_t)CNS_11643_1;
                        choices[1] = (int8_t)GB2312_1;
                    }
                }

                cs = g = 0;
                /*
                 * len==0: no mapping found yet
                 * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
                 * len>0: found a roundtrip result, done
                 */
                len = 0;
                /*
                 * We will turn off useFallback after finding a fallback,
                 * but we still get fallbacks from PUA code points as usual.
                 * Therefore, we will also need to check that we don't overwrite
                 * an early fallback with a later one.
                 */
                useFallback = cnv->useFallback;

                for(i = 0; i < choiceCount && len <= 0; ++i) {
                    int8_t cs0 = choices[i];
                    if(cs0 > 0) {
                        uint32_t value;
                        int32_t len2;
                        if(cs0 >= CNS_11643_0) {
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[CNS_11643],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_3);
                            if(len2 == 3 || (len2 == -3 && len == 0)) {
                                targetValue = value;
                                cs = (int8_t)(CNS_11643_0 + (value >> 16) - 0x80);
                                if(len2 >= 0) {
                                    len = 2;
                                } else {
                                    len = -2;
                                    useFallback = FALSE;
                                }
                                if(cs == CNS_11643_1) {
                                    g = 1;
                                } else if(cs == CNS_11643_2) {
                                    g = 2;
                                } else /* plane 3..7 */ if(converterData->version == 1) {
                                    g = 3;
                                } else {
                                    /* ISO-2022-CN (without -EXT) does not support plane 3..7 */
                                    len = 0;
                                }
                            }
                        } else {
                            /* GB2312_1 or ISO-IR-165 */
                            U_ASSERT(cs0<UCNV_2022_MAX_CONVERTERS);
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[cs0],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_2);
                            if(len2 == 2 || (len2 == -2 && len == 0)) {
                                targetValue = value;
                                len = len2;
                                cs = cs0;
                                g = 1;
                                useFallback = FALSE;
                            }
                        }
                    }
                }

                if(len != 0) {
                    len = 0; /* count output bytes; it must have been abs(len) == 2 */

                    /* write the designation sequence if necessary */
                    if(cs != pFromU2022State->cs[g]) {
                        if(cs < CNS_11643) {
                            uprv_memcpy(buffer, escSeqCharsCN[cs], 4);
                        } else {
                            U_ASSERT(cs >= CNS_11643_1);
                            uprv_memcpy(buffer, escSeqCharsCN[CNS_11643 + (cs - CNS_11643_1)], 4);
                        }
                        len = 4;
                        pFromU2022State->cs[g] = cs;
                        if(g == 1) {
                            /* changing the SO/G1 charset invalidates the choices[] */
                            choiceCount = 0;
                        }
                    }

                    /* write the shift sequence if necessary */
                    if(g != pFromU2022State->g) {
                        switch(g) {
                        case 1:
                            buffer[len++] = UCNV_SO;

                            /* set the new state only if it is the locking shift SO/G1, not for SS2 or SS3 */
                            pFromU2022State->g = 1;
                            break;
                        case 2:
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4e;
                            break;
                        default: /* case 3 */
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4f;
                            break;
                        }
                    }

                    /* write the two output bytes */
                    buffer[len++] = (char)(targetValue >> 8);
                    buffer[len++] = (char)targetValue;
                } else {
                    /* if we cannot find the character after checking all codepages
                     * then this is an error
                     */
                    *err = U_INVALID_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* output len>0 bytes in buffer[] */
            if(len == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(len == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, len,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-CN conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        pFromU2022State->g!=0 &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        pFromU2022State->g=0;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}